

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_avx2.c
# Opt level: O0

void highbd_blend_a64_d16_mask_w8_avx2
               (uint16_t *dst,int dst_stride,CONV_BUF_TYPE *src0,int src0_stride,CONV_BUF_TYPE *src1
               ,int src1_stride,__m256i *mask0a,__m256i *mask0b,__m256i *round_offset,int shift,
               __m256i *clip_low,__m256i *clip_high,__m256i *mask_max)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  __m256i a;
  __m256i a_00;
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined8 in_XMM0_Qa;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 in_XMM0_Qb;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 in_YMM0_H;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 in_register_00001218;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined1 (*in_stack_00000008) [32];
  undefined4 in_stack_0000002c;
  __m256i packa;
  __m256i roundbl;
  __m256i roundbh;
  __m256i roundal;
  __m256i roundah;
  __m256i sumbl;
  __m256i sumbh;
  __m256i mul1bl;
  __m256i mul1bh;
  __m256i mul1b_lows;
  __m256i mul1b_highs;
  __m256i mul0bl;
  __m256i mul0bh;
  __m256i mul0b_lows;
  __m256i mul0b_highs;
  __m256i sumal;
  __m256i sumah;
  __m256i mul1al;
  __m256i mul1ah;
  __m256i mul1a_lows;
  __m256i mul1a_highs;
  __m256i mul0al;
  __m256i mul0ah;
  __m256i mul0a_lows;
  __m256i mul0a_highs;
  __m256i mask1b;
  __m256i mask1a;
  __m256i s1b;
  __m256i s1a;
  __m256i s0b;
  __m256i s0a;
  undefined1 auVar22 [24];
  void *lo;
  void *hi;
  undefined1 in_stack_fffffffffffff260 [32];
  
  hi = in_stack_fffffffffffff260._8_8_;
  lo = in_stack_fffffffffffff260._0_8_;
  yy_loadu2_128(hi,lo);
  uVar10 = in_XMM0_Qa;
  uVar13 = in_XMM0_Qb;
  uVar16 = in_YMM0_H;
  uVar19 = in_register_00001218;
  yy_loadu2_128(hi,lo);
  uVar11 = uVar10;
  uVar14 = uVar13;
  uVar17 = uVar16;
  uVar20 = uVar19;
  yy_loadu2_128(hi,lo);
  uVar12 = uVar11;
  uVar15 = uVar14;
  uVar18 = uVar17;
  uVar21 = uVar20;
  yy_loadu2_128(hi,lo);
  auVar3 = vpsubw_avx2((undefined1  [32])*clip_high,*in_stack_00000008);
  auVar4 = vpsubw_avx2((undefined1  [32])*clip_high,(undefined1  [32])*mask0a);
  auVar2._8_8_ = in_XMM0_Qb;
  auVar2._0_8_ = in_XMM0_Qa;
  auVar2._16_8_ = in_YMM0_H;
  auVar2._24_8_ = in_register_00001218;
  auVar1 = vpmulhuw_avx2(*in_stack_00000008,auVar2);
  auVar9._8_8_ = in_XMM0_Qb;
  auVar9._0_8_ = in_XMM0_Qa;
  auVar9._16_8_ = in_YMM0_H;
  auVar9._24_8_ = in_register_00001218;
  auVar2 = vpmullw_avx2(*in_stack_00000008,auVar9);
  auVar5 = vpunpckhwd_avx2(auVar2,auVar1);
  auVar6 = vpunpcklwd_avx2(auVar2,auVar1);
  auVar1._8_8_ = uVar14;
  auVar1._0_8_ = uVar11;
  auVar1._16_8_ = uVar17;
  auVar1._24_8_ = uVar20;
  auVar1 = vpmulhuw_avx2(auVar3,auVar1);
  auVar7._8_8_ = uVar14;
  auVar7._0_8_ = uVar11;
  auVar7._16_8_ = uVar17;
  auVar7._24_8_ = uVar20;
  auVar2 = vpmullw_avx2(auVar3,auVar7);
  auVar3 = vpunpckhwd_avx2(auVar2,auVar1);
  auVar2 = vpunpcklwd_avx2(auVar2,auVar1);
  auVar1 = vpaddd_avx2(auVar5,auVar3);
  auVar2 = vpaddd_avx2(auVar6,auVar2);
  auVar5._8_8_ = uVar13;
  auVar5._0_8_ = uVar10;
  auVar5._16_8_ = uVar16;
  auVar5._24_8_ = uVar19;
  auVar3 = vpmulhuw_avx2((undefined1  [32])*mask0a,auVar5);
  auVar6._8_8_ = uVar13;
  auVar6._0_8_ = uVar10;
  auVar6._16_8_ = uVar16;
  auVar6._24_8_ = uVar19;
  auVar5 = vpmullw_avx2((undefined1  [32])*mask0a,auVar6);
  auVar6 = vpunpckhwd_avx2(auVar5,auVar3);
  auVar7 = vpunpcklwd_avx2(auVar5,auVar3);
  auVar3._8_8_ = uVar15;
  auVar3._0_8_ = uVar12;
  auVar3._16_8_ = uVar18;
  auVar3._24_8_ = uVar21;
  auVar3 = vpmulhuw_avx2(auVar4,auVar3);
  auVar8._8_8_ = uVar15;
  auVar8._0_8_ = uVar12;
  auVar8._16_8_ = uVar18;
  auVar8._24_8_ = uVar21;
  auVar5 = vpmullw_avx2(auVar4,auVar8);
  auVar4 = vpunpckhwd_avx2(auVar5,auVar3);
  auVar5 = vpunpcklwd_avx2(auVar5,auVar3);
  auVar3 = vpaddd_avx2(auVar6,auVar4);
  auVar5 = vpaddd_avx2(auVar7,auVar5);
  auVar1 = vpsubd_avx2(auVar1,(undefined1  [32])*mask0b);
  auVar1 = vpsrad_avx2(auVar1,ZEXT416((uint)round_offset));
  auVar2 = vpsubd_avx2(auVar2,(undefined1  [32])*mask0b);
  auVar2 = vpsrad_avx2(auVar2,ZEXT416((uint)round_offset));
  auVar3 = vpsubd_avx2(auVar3,(undefined1  [32])*mask0b);
  auVar3 = vpsrad_avx2(auVar3,ZEXT416((uint)round_offset));
  auVar5 = vpsubd_avx2(auVar5,(undefined1  [32])*mask0b);
  auVar5 = vpsrad_avx2(auVar5,ZEXT416((uint)round_offset));
  auVar1 = vpackssdw_avx2(auVar2,auVar1);
  auVar1 = vpmaxsw_avx2(auVar1,*(undefined1 (*) [32])CONCAT44(in_stack_0000002c,shift));
  vpminsw_avx2(auVar1,(undefined1  [32])*clip_low);
  auVar1 = vpackssdw_avx2(auVar5,auVar3);
  auVar2 = vpmaxsw_avx2(auVar1,*(undefined1 (*) [32])CONCAT44(in_stack_0000002c,shift));
  auVar2 = vpminsw_avx2(auVar2,(undefined1  [32])*clip_low);
  auVar22 = auVar2._0_24_;
  a[1] = auVar22._0_8_;
  a[2] = auVar22._8_8_;
  a[3] = auVar22._16_8_;
  a[0] = 0x5f8d06;
  yy_storeu2_128(auVar1._16_8_,auVar1._8_8_,a);
  a_00[1] = auVar22._0_8_;
  a_00[2] = auVar22._8_8_;
  a_00[3] = auVar22._16_8_;
  a_00[0] = 0x5f8d41;
  yy_storeu2_128(auVar1._16_8_,auVar1._8_8_,a_00);
  return;
}

Assistant:

static inline void highbd_blend_a64_d16_mask_w8_avx2(
    uint16_t *dst, int dst_stride, const CONV_BUF_TYPE *src0, int src0_stride,
    const CONV_BUF_TYPE *src1, int src1_stride, const __m256i *mask0a,
    const __m256i *mask0b, const __m256i *round_offset, int shift,
    const __m256i *clip_low, const __m256i *clip_high,
    const __m256i *mask_max) {
  // Load 8x u16 pixels from each of 4 rows from each source
  const __m256i s0a =
      yy_loadu2_128(src0 + 0 * src0_stride, src0 + 1 * src0_stride);
  const __m256i s0b =
      yy_loadu2_128(src0 + 2 * src0_stride, src0 + 3 * src0_stride);
  const __m256i s1a =
      yy_loadu2_128(src1 + 0 * src1_stride, src1 + 1 * src1_stride);
  const __m256i s1b =
      yy_loadu2_128(src1 + 2 * src1_stride, src1 + 3 * src1_stride);

  // Generate inverse masks
  const __m256i mask1a = _mm256_sub_epi16(*mask_max, *mask0a);
  const __m256i mask1b = _mm256_sub_epi16(*mask_max, *mask0b);

  // Multiply sources by respective masks
  const __m256i mul0a_highs = _mm256_mulhi_epu16(*mask0a, s0a);
  const __m256i mul0a_lows = _mm256_mullo_epi16(*mask0a, s0a);
  const __m256i mul0ah = _mm256_unpackhi_epi16(mul0a_lows, mul0a_highs);
  const __m256i mul0al = _mm256_unpacklo_epi16(mul0a_lows, mul0a_highs);
  // Note that AVX2 unpack orders 64-bit words as [3 1] [2 0] to keep within
  // lanes Later, packs does the same again which cancels this out with no need
  // for a permute.  The intermediate values being reordered makes no difference

  const __m256i mul1a_highs = _mm256_mulhi_epu16(mask1a, s1a);
  const __m256i mul1a_lows = _mm256_mullo_epi16(mask1a, s1a);
  const __m256i mul1ah = _mm256_unpackhi_epi16(mul1a_lows, mul1a_highs);
  const __m256i mul1al = _mm256_unpacklo_epi16(mul1a_lows, mul1a_highs);

  const __m256i sumah = _mm256_add_epi32(mul0ah, mul1ah);
  const __m256i sumal = _mm256_add_epi32(mul0al, mul1al);

  const __m256i mul0b_highs = _mm256_mulhi_epu16(*mask0b, s0b);
  const __m256i mul0b_lows = _mm256_mullo_epi16(*mask0b, s0b);
  const __m256i mul0bh = _mm256_unpackhi_epi16(mul0b_lows, mul0b_highs);
  const __m256i mul0bl = _mm256_unpacklo_epi16(mul0b_lows, mul0b_highs);

  const __m256i mul1b_highs = _mm256_mulhi_epu16(mask1b, s1b);
  const __m256i mul1b_lows = _mm256_mullo_epi16(mask1b, s1b);
  const __m256i mul1bh = _mm256_unpackhi_epi16(mul1b_lows, mul1b_highs);
  const __m256i mul1bl = _mm256_unpacklo_epi16(mul1b_lows, mul1b_highs);

  const __m256i sumbh = _mm256_add_epi32(mul0bh, mul1bh);
  const __m256i sumbl = _mm256_add_epi32(mul0bl, mul1bl);

  // Divide down each result, with rounding
  const __m256i roundah =
      _mm256_srai_epi32(_mm256_sub_epi32(sumah, *round_offset), shift);
  const __m256i roundal =
      _mm256_srai_epi32(_mm256_sub_epi32(sumal, *round_offset), shift);
  const __m256i roundbh =
      _mm256_srai_epi32(_mm256_sub_epi32(sumbh, *round_offset), shift);
  const __m256i roundbl =
      _mm256_srai_epi32(_mm256_sub_epi32(sumbl, *round_offset), shift);

  // Pack each i32 down to an i16 with saturation, then clip to valid range
  const __m256i packa = _mm256_packs_epi32(roundal, roundah);
  const __m256i clipa =
      _mm256_min_epi16(_mm256_max_epi16(packa, *clip_low), *clip_high);
  const __m256i packb = _mm256_packs_epi32(roundbl, roundbh);
  const __m256i clipb =
      _mm256_min_epi16(_mm256_max_epi16(packb, *clip_low), *clip_high);

  // Store 8x u16 pixels to each of 4 rows in the destination
  yy_storeu2_128(dst + 0 * dst_stride, dst + 1 * dst_stride, clipa);
  yy_storeu2_128(dst + 2 * dst_stride, dst + 3 * dst_stride, clipb);
}